

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_attribute_iterator * __thiscall
pugi::xml_attribute_iterator::operator--(xml_attribute_iterator *this)

{
  xml_attribute_iterator *in_RDI;
  xml_attribute_struct *local_10;
  
  if ((in_RDI->_wrap)._attr == (xml_attribute_struct *)0x0) {
    local_10 = (xml_attribute_struct *)xml_node::last_attribute((xml_node *)in_RDI);
  }
  else {
    local_10 = (xml_attribute_struct *)xml_attribute::previous_attribute(&in_RDI->_wrap);
  }
  (in_RDI->_wrap)._attr = local_10;
  return in_RDI;
}

Assistant:

PUGI_IMPL_FN xml_attribute_iterator& xml_attribute_iterator::operator--()
	{
		_wrap = _wrap._attr ? _wrap.previous_attribute() : _parent.last_attribute();
		return *this;
	}